

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

void __thiscall cmComputeLinkDepends::AddDirectLinkEntries(cmComputeLinkDepends *this)

{
  LinkImplementation *libs;
  cmTarget **__v;
  pointer pcVar1;
  
  libs = cmTarget::GetLinkImplementation(this->Target,&this->Config);
  AddLinkEntries<cmLinkImplItem>
            (this,-1,(vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)libs);
  pcVar1 = (libs->super_LinkImplementationLibraries).WrongConfigLibraries.
           super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar1 != (libs->super_LinkImplementationLibraries).WrongConfigLibraries.
                super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    __v = &pcVar1->Target;
    do {
      if (((this->OldLinkDirMode == true) && (*__v != (cmTarget *)0x0)) &&
         ((*__v)->IsImportedTarget == false)) {
        std::
        _Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
        ::_M_insert_unique<cmTarget_const*const&>
                  ((_Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
                    *)&this->OldWrongConfigItems,__v);
      }
      pcVar1 = (pointer)(__v + 1);
      __v = __v + 5;
    } while (pcVar1 != (libs->super_LinkImplementationLibraries).WrongConfigLibraries.
                       super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::AddDirectLinkEntries()
{
  // Add direct link dependencies in this configuration.
  cmTarget::LinkImplementation const* impl =
    this->Target->GetLinkImplementation(this->Config);
  this->AddLinkEntries(-1, impl->Libraries);
  for(std::vector<cmLinkItem>::const_iterator
        wi = impl->WrongConfigLibraries.begin();
      wi != impl->WrongConfigLibraries.end(); ++wi)
    {
    this->CheckWrongConfigItem(*wi);
    }
}